

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O1

void google::protobuf::MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>
               (TestMapLite *message)

{
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  MapFieldLite<int,_proto2_unittest::MapEnumLite> *this_00;
  internal iVar1;
  int *piVar2;
  long *plVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  float *pfVar6;
  double *pdVar7;
  bool *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  MapEnumLite *pMVar10;
  ForeignMessageLite *pFVar11;
  MapFieldLite<int,_proto2_unittest::ForeignMessageLite> *this_01;
  char *__end;
  char *pcVar12;
  char *__end_1;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_31;
  AssertHelper local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  key_arg<int> local_9c;
  MapFieldLite<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  MapFieldLite<bool,_bool> *local_90;
  MapFieldLite<int,_double> *local_88;
  MapFieldLite<int,_float> *local_80;
  MapFieldLite<long,_long> *local_78;
  MapFieldLite<int,_int> *local_70;
  MapFieldLite<unsigned_long,_unsigned_long> *local_68;
  MapFieldLite<unsigned_int,_unsigned_int> *local_60;
  MapFieldLite<long,_long> *local_58;
  MapFieldLite<int,_int> *local_50;
  MapFieldLite<unsigned_long,_unsigned_long> *local_48;
  MapFieldLite<unsigned_int,_unsigned_int> *local_40;
  MapFieldLite<long,_long> *local_38;
  
  local_f0.data_._0_4_ = 2;
  local_c0._4_4_ = 0;
  local_c0._0_4_ = *(uint *)&message->field_0;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_e0,"2","message.map_int32_int32().size()",(int *)&local_f0,
             (unsigned_long *)local_c0);
  iVar1 = local_e0[0];
  if (local_e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_d8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
               ,0x107,pcVar12);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_c0 + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  if (iVar1 != (internal)0x0) {
    local_f0.data_._0_4_ = 2;
    local_c0._4_4_ = 0;
    local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x20);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_e0,"2","message.map_int64_int64().size()",(int *)&local_f0,
               (unsigned_long *)local_c0);
    iVar1 = local_e0[0];
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar12 = "";
      }
      else {
        pcVar12 = (local_d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                 ,0x108,pcVar12);
      testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d8,local_d8);
    }
    if (iVar1 != (internal)0x0) {
      local_f0.data_._0_4_ = 2;
      local_c0._4_4_ = 0;
      local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x40);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_e0,"2","message.map_uint32_uint32().size()",(int *)&local_f0,
                 (unsigned_long *)local_c0);
      iVar1 = local_e0[0];
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_c0);
        if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar12 = "";
        }
        else {
          pcVar12 = (local_d8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                   ,0x109,pcVar12);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_c0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_c0 + 8))();
        }
      }
      if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d8,local_d8);
      }
      if (iVar1 != (internal)0x0) {
        local_f0.data_._0_4_ = 2;
        local_c0._4_4_ = 0;
        local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x60);
        testing::internal::CmpHelperEQ<int,unsigned_long>
                  ((internal *)local_e0,"2","message.map_uint64_uint64().size()",(int *)&local_f0,
                   (unsigned_long *)local_c0);
        iVar1 = local_e0[0];
        if (local_e0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar12 = "";
          }
          else {
            pcVar12 = (local_d8->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                     ,0x10a,pcVar12);
          testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper(&local_f0);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
        if (iVar1 != (internal)0x0) {
          local_f0.data_._0_4_ = 2;
          local_c0._4_4_ = 0;
          local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x80);
          testing::internal::CmpHelperEQ<int,unsigned_long>
                    ((internal *)local_e0,"2","message.map_sint32_sint32().size()",(int *)&local_f0,
                     (unsigned_long *)local_c0);
          iVar1 = local_e0[0];
          if (local_e0[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_c0);
            if (local_d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar12 = "";
            }
            else {
              pcVar12 = (local_d8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                       ,0x10b,pcVar12);
            testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            if (local_c0 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_c0 + 8))();
            }
          }
          if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8,local_d8);
          }
          if (iVar1 != (internal)0x0) {
            local_f0.data_._0_4_ = 2;
            local_c0._4_4_ = 0;
            local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0xa0);
            testing::internal::CmpHelperEQ<int,unsigned_long>
                      ((internal *)local_e0,"2","message.map_sint64_sint64().size()",
                       (int *)&local_f0,(unsigned_long *)local_c0);
            iVar1 = local_e0[0];
            if (local_e0[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_c0);
              if (local_d8 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar12 = "";
              }
              else {
                pcVar12 = (local_d8->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_f0,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                         ,0x10c,pcVar12);
              testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
              testing::internal::AssertHelper::~AssertHelper(&local_f0);
              if (local_c0 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_c0 + 8))();
              }
            }
            if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,local_d8);
            }
            if (iVar1 != (internal)0x0) {
              local_f0.data_._0_4_ = 2;
              local_c0._4_4_ = 0;
              local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0xc0);
              testing::internal::CmpHelperEQ<int,unsigned_long>
                        ((internal *)local_e0,"2","message.map_fixed32_fixed32().size()",
                         (int *)&local_f0,(unsigned_long *)local_c0);
              iVar1 = local_e0[0];
              if (local_e0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_c0);
                if (local_d8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar12 = "";
                }
                else {
                  pcVar12 = (local_d8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_f0,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                           ,0x10d,pcVar12);
                testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
                testing::internal::AssertHelper::~AssertHelper(&local_f0);
                if (local_c0 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_c0 + 8))();
                }
              }
              if (local_d8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_d8,local_d8);
              }
              if (iVar1 != (internal)0x0) {
                local_f0.data_._0_4_ = 2;
                local_c0._4_4_ = 0;
                local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0xe0);
                testing::internal::CmpHelperEQ<int,unsigned_long>
                          ((internal *)local_e0,"2","message.map_fixed64_fixed64().size()",
                           (int *)&local_f0,(unsigned_long *)local_c0);
                iVar1 = local_e0[0];
                if (local_e0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_c0);
                  if (local_d8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar12 = "";
                  }
                  else {
                    pcVar12 = (local_d8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_f0,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                             ,0x10e,pcVar12);
                  testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
                  testing::internal::AssertHelper::~AssertHelper(&local_f0);
                  if (local_c0 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_c0 + 8))();
                  }
                }
                if (local_d8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_d8,local_d8);
                }
                if (iVar1 != (internal)0x0) {
                  local_f0.data_._0_4_ = 2;
                  local_c0._4_4_ = 0;
                  local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x100);
                  testing::internal::CmpHelperEQ<int,unsigned_long>
                            ((internal *)local_e0,"2","message.map_sfixed32_sfixed32().size()",
                             (int *)&local_f0,(unsigned_long *)local_c0);
                  iVar1 = local_e0[0];
                  if (local_e0[0] == (internal)0x0) {
                    testing::Message::Message((Message *)local_c0);
                    if (local_d8 ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar12 = "";
                    }
                    else {
                      pcVar12 = (local_d8->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_f0,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                               ,0x10f,pcVar12);
                    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
                    testing::internal::AssertHelper::~AssertHelper(&local_f0);
                    if (local_c0 != (undefined1  [8])0x0) {
                      (**(code **)(*(long *)local_c0 + 8))();
                    }
                  }
                  if (local_d8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_d8,local_d8);
                  }
                  if (iVar1 != (internal)0x0) {
                    local_f0.data_._0_4_ = 2;
                    local_c0._4_4_ = 0;
                    local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x120);
                    testing::internal::CmpHelperEQ<int,unsigned_long>
                              ((internal *)local_e0,"2","message.map_sfixed64_sfixed64().size()",
                               (int *)&local_f0,(unsigned_long *)local_c0);
                    iVar1 = local_e0[0];
                    if (local_e0[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_c0);
                      if (local_d8 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar12 = "";
                      }
                      else {
                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_f0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                 ,0x110,pcVar12);
                      testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                      if (local_c0 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_c0 + 8))();
                      }
                    }
                    if (local_d8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_d8,local_d8);
                    }
                    if (iVar1 != (internal)0x0) {
                      local_f0.data_._0_4_ = 2;
                      local_c0._4_4_ = 0;
                      local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x140);
                      testing::internal::CmpHelperEQ<int,unsigned_long>
                                ((internal *)local_e0,"2","message.map_int32_float().size()",
                                 (int *)&local_f0,(unsigned_long *)local_c0);
                      iVar1 = local_e0[0];
                      if (local_e0[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_c0);
                        if (local_d8 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar12 = "";
                        }
                        else {
                          pcVar12 = (local_d8->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_f0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                   ,0x111,pcVar12);
                        testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
                        testing::internal::AssertHelper::~AssertHelper(&local_f0);
                        if (local_c0 != (undefined1  [8])0x0) {
                          (**(code **)(*(long *)local_c0 + 8))();
                        }
                      }
                      if (local_d8 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_d8,local_d8);
                      }
                      if (iVar1 != (internal)0x0) {
                        local_f0.data_._0_4_ = 2;
                        local_c0._4_4_ = 0;
                        local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x160);
                        testing::internal::CmpHelperEQ<int,unsigned_long>
                                  ((internal *)local_e0,"2","message.map_int32_double().size()",
                                   (int *)&local_f0,(unsigned_long *)local_c0);
                        iVar1 = local_e0[0];
                        if (local_e0[0] == (internal)0x0) {
                          testing::Message::Message((Message *)local_c0);
                          if (local_d8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar12 = "";
                          }
                          else {
                            pcVar12 = (local_d8->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_f0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                     ,0x112,pcVar12);
                          testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c0);
                          testing::internal::AssertHelper::~AssertHelper(&local_f0);
                          if (local_c0 != (undefined1  [8])0x0) {
                            (**(code **)(*(long *)local_c0 + 8))();
                          }
                        }
                        if (local_d8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_d8,local_d8);
                        }
                        if (iVar1 != (internal)0x0) {
                          local_f0.data_._0_4_ = 2;
                          local_c0._4_4_ = 0;
                          local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x180);
                          testing::internal::CmpHelperEQ<int,unsigned_long>
                                    ((internal *)local_e0,"2","message.map_bool_bool().size()",
                                     (int *)&local_f0,(unsigned_long *)local_c0);
                          iVar1 = local_e0[0];
                          if (local_e0[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_c0);
                            if (local_d8 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pcVar12 = "";
                            }
                            else {
                              pcVar12 = (local_d8->_M_dataplus)._M_p;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                       ,0x113,pcVar12);
                            testing::internal::AssertHelper::operator=
                                      (&local_f0,(Message *)local_c0);
                            testing::internal::AssertHelper::~AssertHelper(&local_f0);
                            if (local_c0 != (undefined1  [8])0x0) {
                              (**(code **)(*(long *)local_c0 + 8))();
                            }
                          }
                          if (local_d8 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_d8,local_d8);
                          }
                          if (iVar1 != (internal)0x0) {
                            local_f0.data_._0_4_ = 2;
                            local_c0._4_4_ = 0;
                            local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x1a0);
                            testing::internal::CmpHelperEQ<int,unsigned_long>
                                      ((internal *)local_e0,"2","message.map_string_string().size()"
                                       ,(int *)&local_f0,(unsigned_long *)local_c0);
                            iVar1 = local_e0[0];
                            if (local_e0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)local_c0);
                              if (local_d8 ==
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar12 = "";
                              }
                              else {
                                pcVar12 = (local_d8->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_f0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                         ,0x114,pcVar12);
                              testing::internal::AssertHelper::operator=
                                        (&local_f0,(Message *)local_c0);
                              testing::internal::AssertHelper::~AssertHelper(&local_f0);
                              if (local_c0 != (undefined1  [8])0x0) {
                                (**(code **)(*(long *)local_c0 + 8))();
                              }
                            }
                            if (local_d8 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_d8,local_d8);
                            }
                            if (iVar1 != (internal)0x0) {
                              local_f0.data_._0_4_ = 2;
                              local_c0._4_4_ = 0;
                              local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x1c0);
                              testing::internal::CmpHelperEQ<int,unsigned_long>
                                        ((internal *)local_e0,"2","message.map_int32_bytes().size()"
                                         ,(int *)&local_f0,(unsigned_long *)local_c0);
                              iVar1 = local_e0[0];
                              if (local_e0[0] == (internal)0x0) {
                                testing::Message::Message((Message *)local_c0);
                                if (local_d8 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  pcVar12 = "";
                                }
                                else {
                                  pcVar12 = (local_d8->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_f0,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                           ,0x115,pcVar12);
                                testing::internal::AssertHelper::operator=
                                          (&local_f0,(Message *)local_c0);
                                testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                if (local_c0 != (undefined1  [8])0x0) {
                                  (**(code **)(*(long *)local_c0 + 8))();
                                }
                              }
                              if (local_d8 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_d8,local_d8);
                              }
                              if (iVar1 != (internal)0x0) {
                                local_f0.data_._0_4_ = 2;
                                local_c0._4_4_ = 0;
                                local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x1e0);
                                testing::internal::CmpHelperEQ<int,unsigned_long>
                                          ((internal *)local_e0,"2",
                                           "message.map_int32_enum().size()",(int *)&local_f0,
                                           (unsigned_long *)local_c0);
                                iVar1 = local_e0[0];
                                if (local_e0[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)local_c0);
                                  if (local_d8 ==
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    pcVar12 = "";
                                  }
                                  else {
                                    pcVar12 = (local_d8->_M_dataplus)._M_p;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_f0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                             ,0x116,pcVar12);
                                  testing::internal::AssertHelper::operator=
                                            (&local_f0,(Message *)local_c0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                  if (local_c0 != (undefined1  [8])0x0) {
                                    (**(code **)(*(long *)local_c0 + 8))();
                                  }
                                }
                                if (local_d8 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_d8,local_d8);
                                }
                                if (iVar1 != (internal)0x0) {
                                  local_f0.data_._0_4_ = 2;
                                  local_c0._4_4_ = 0;
                                  local_c0._0_4_ = *(uint *)((long)&message->field_0 + 0x200);
                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                            ((internal *)local_e0,"2",
                                             "message.map_int32_foreign_message().size()",
                                             (int *)&local_f0,(unsigned_long *)local_c0);
                                  iVar1 = local_e0[0];
                                  if (local_e0[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)local_c0);
                                    if (local_d8 ==
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      pcVar12 = "";
                                    }
                                    else {
                                      pcVar12 = (local_d8->_M_dataplus)._M_p;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_f0,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                               ,0x117,pcVar12);
                                    testing::internal::AssertHelper::operator=
                                              (&local_f0,(Message *)local_c0);
                                    testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                    if (local_c0 != (undefined1  [8])0x0) {
                                      (**(code **)(*(long *)local_c0 + 8))();
                                    }
                                  }
                                  if (local_d8 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                  }
                                  if (iVar1 != (internal)0x0) {
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    piVar2 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)&(message->field_0)._impl_,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"0",
                                               "message.map_int32_int32().at(0)",(int *)local_c0,
                                               piVar2);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x119,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_38 = &(message->field_0)._impl_.map_int64_int64_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 0;
                                    local_c0 = (undefined1  [8])0x0;
                                    plVar3 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_38,
                                                        (key_arg<long> *)local_c0);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_e0,"0",
                                               "message.map_int64_int64().at(0)",(int *)&local_f0,
                                               plVar3);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11a,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_40 = &(message->field_0)._impl_.map_uint32_uint32_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)local_40,
                                                        (key_arg<unsigned_int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_e0,"0",
                                               "message.map_uint32_uint32().at(0)",(int *)local_c0,
                                               puVar4);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11b,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_48 = &(message->field_0)._impl_.map_uint64_uint64_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 0;
                                    local_c0 = (undefined1  [8])0x0;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)
                                                        local_48,(key_arg<unsigned_long> *)local_c0)
                                    ;
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_e0,"0",
                                               "message.map_uint64_uint64().at(0)",(int *)&local_f0,
                                               puVar5);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11c,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_50 = &(message->field_0)._impl_.map_sint32_sint32_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    piVar2 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)local_50,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"0",
                                               "message.map_sint32_sint32().at(0)",(int *)local_c0,
                                               piVar2);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11d,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_58 = &(message->field_0)._impl_.map_sint64_sint64_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 0;
                                    local_c0 = (undefined1  [8])0x0;
                                    plVar3 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_58,
                                                        (key_arg<long> *)local_c0);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_e0,"0",
                                               "message.map_sint64_sint64().at(0)",(int *)&local_f0,
                                               plVar3);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11e,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_60 = &(message->field_0)._impl_.map_fixed32_fixed32_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)local_60,
                                                        (key_arg<unsigned_int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_e0,"0",
                                               "message.map_fixed32_fixed32().at(0)",(int *)local_c0
                                               ,puVar4);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x11f,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_68 = &(message->field_0)._impl_.map_fixed64_fixed64_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 0;
                                    local_c0 = (undefined1  [8])0x0;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)
                                                        local_68,(key_arg<unsigned_long> *)local_c0)
                                    ;
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_e0,"0",
                                               "message.map_fixed64_fixed64().at(0)",
                                               (int *)&local_f0,puVar5);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x120,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_70 = &(message->field_0)._impl_.map_sfixed32_sfixed32_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    piVar2 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)local_70,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"0",
                                               "message.map_sfixed32_sfixed32().at(0)",
                                               (int *)local_c0,piVar2);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x121,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_78 = &(message->field_0)._impl_.map_sfixed64_sfixed64_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 0;
                                    local_c0 = (undefined1  [8])0x0;
                                    plVar3 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_78,
                                                        (key_arg<long> *)local_c0);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_e0,"0",
                                               "message.map_sfixed64_sfixed64().at(0)",
                                               (int *)&local_f0,plVar3);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x122,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_80 = &(message->field_0)._impl_.map_int32_float_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    pfVar6 = Map<int,_float>::at<int>
                                                       ((Map<int,_float> *)local_80,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,float>
                                              ((internal *)local_e0,"0",
                                               "message.map_int32_float().at(0)",(int *)local_c0,
                                               pfVar6);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x123,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_88 = &(message->field_0)._impl_.map_int32_double_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_f0.data_._0_4_ = 0;
                                    pdVar7 = Map<int,_double>::at<int>
                                                       ((Map<int,_double> *)local_88,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,double>
                                              ((internal *)local_e0,"0",
                                               "message.map_int32_double().at(0)",(int *)local_c0,
                                               pdVar7);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x124,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    local_90 = &(message->field_0)._impl_.map_bool_bool_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffffffffff00);
                                    local_f0.data_._0_4_ = (uint)local_f0.data_ & 0xffffff00;
                                    pbVar8 = Map<bool,_bool>::at<bool>
                                                       ((Map<bool,_bool> *)local_90,
                                                        (key_arg<bool> *)&local_f0);
                                    testing::internal::CmpHelperEQ<bool,bool>
                                              ((internal *)local_e0,"false",
                                               "message.map_bool_bool().at(0)",(bool *)local_c0,
                                               pbVar8);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x125,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_e0 = (undefined1  [8])&local_d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_e0,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    local_c0 = (undefined1  [8])&local_b0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_c0,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    this = &(message->field_0)._impl_.map_string_string_;
                                    pbVar9 = Map<std::__cxx11::string,std::__cxx11::string>::
                                             at<std::__cxx11::string>
                                                       ((
                                                  Map<std::__cxx11::string,std::__cxx11::string> *)
                                                  this,(key_arg<std::__cxx11::basic_string<char>_> *
                                                       )local_c0);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&local_f0,"long_string()",
                                               "message.map_string_string().at(long_string())",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_e0,pbVar9);
                                    if (local_c0 != (undefined1  [8])&local_b0) {
                                      operator_delete((void *)local_c0,
                                                      local_b0._M_allocated_capacity + 1);
                                    }
                                    if (local_e0 != (undefined1  [8])&local_d0) {
                                      operator_delete((void *)local_e0,
                                                      local_d0._M_allocated_capacity + 1);
                                    }
                                    if (local_f0.data_._0_1_ == (internal)0x0) {
                                      testing::Message::Message((Message *)local_e0);
                                      if (local_e8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_e8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_c0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x126,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_c0,(Message *)local_e0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_c0);
                                      if (local_e0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_e0 + 8))();
                                      }
                                    }
                                    local_98 = &(message->field_0)._impl_.map_int32_bytes_;
                                    if (local_e8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                    }
                                    local_e0 = (undefined1  [8])&local_d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_e0,
                                               "This is a very long string that goes in the heap",""
                                              );
                                    local_f0.data_._0_4_ = 0;
                                    pbVar9 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             ::at<int>((
                                                  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_98,(key_arg<int> *)&local_f0);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)local_c0,"long_string()",
                                               "message.map_int32_bytes().at(0)",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_e0,pbVar9);
                                    if (local_e0 != (undefined1  [8])&local_d0) {
                                      operator_delete((void *)local_e0,
                                                      local_d0._M_allocated_capacity + 1);
                                    }
                                    if (local_c0[0] == (string)0x0) {
                                      testing::Message::Message((Message *)local_e0);
                                      if (local_b8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_b8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x127,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_e0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_e0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_e0 + 8))();
                                      }
                                    }
                                    this_00 = &(message->field_0)._impl_.map_int32_enum_;
                                    if (local_b8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_b8,local_b8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 0;
                                    pMVar10 = Map<int,_proto2_unittest::MapEnumLite>::at<int>
                                                        ((Map<int,_proto2_unittest::MapEnumLite> *)
                                                         this_00,(key_arg<int> *)&local_f0);
                                    testing::internal::
                                    CmpHelperEQ<proto2_unittest::MapEnumLite,proto2_unittest::MapEnumLite>
                                              ((internal *)local_e0,"MapEnum_BAR<TestMap>()",
                                               "message.map_int32_enum().at(0)",
                                               (MapEnumLite *)local_c0,pMVar10);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x128,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    this_01 = &(message->field_0)._impl_.map_int32_foreign_message_;
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0 = (undefined1  [8])
                                               ((ulong)local_c0 & 0xffffffff00000000);
                                    local_9c = 0;
                                    pFVar11 = Map<int,_proto2_unittest::ForeignMessageLite>::at<int>
                                                        ((
                                                  Map<int,_proto2_unittest::ForeignMessageLite> *)
                                                  this_01,&local_9c);
                                    local_f0.data_._0_4_ = (pFVar11->field_0)._impl_.c_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"0",
                                               "message.map_int32_foreign_message().at(0).c()",
                                               (int *)local_c0,(int *)&local_f0);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x129,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    piVar2 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)&(message->field_0)._impl_,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"1",
                                               "message.map_int32_int32().at(1)",(int *)local_c0,
                                               piVar2);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,299,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 1;
                                    local_c0 = (undefined1  [8])0x1;
                                    plVar3 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_38,
                                                        (key_arg<long> *)local_c0);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_e0,"1",
                                               "message.map_int64_int64().at(1)",(int *)&local_f0,
                                               plVar3);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,300,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)local_40,
                                                        (key_arg<unsigned_int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_e0,"1",
                                               "message.map_uint32_uint32().at(1)",(int *)local_c0,
                                               puVar4);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12d,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 1;
                                    local_c0 = (undefined1  [8])0x1;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)
                                                        local_48,(key_arg<unsigned_long> *)local_c0)
                                    ;
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_e0,"1",
                                               "message.map_uint64_uint64().at(1)",(int *)&local_f0,
                                               puVar5);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12e,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    piVar2 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)local_50,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"1",
                                               "message.map_sint32_sint32().at(1)",(int *)local_c0,
                                               piVar2);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x12f,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 1;
                                    local_c0 = (undefined1  [8])0x1;
                                    plVar3 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_58,
                                                        (key_arg<long> *)local_c0);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_e0,"1",
                                               "message.map_sint64_sint64().at(1)",(int *)&local_f0,
                                               plVar3);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x130,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    puVar4 = Map<unsigned_int,_unsigned_int>::at<unsigned_int>
                                                       ((Map<unsigned_int,_unsigned_int> *)local_60,
                                                        (key_arg<unsigned_int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,unsigned_int>
                                              ((internal *)local_e0,"1",
                                               "message.map_fixed32_fixed32().at(1)",(int *)local_c0
                                               ,puVar4);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x131,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 1;
                                    local_c0 = (undefined1  [8])0x1;
                                    puVar5 = Map<unsigned_long,_unsigned_long>::at<unsigned_long>
                                                       ((Map<unsigned_long,_unsigned_long> *)
                                                        local_68,(key_arg<unsigned_long> *)local_c0)
                                    ;
                                    testing::internal::CmpHelperEQ<int,unsigned_long>
                                              ((internal *)local_e0,"1",
                                               "message.map_fixed64_fixed64().at(1)",
                                               (int *)&local_f0,puVar5);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x132,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    piVar2 = Map<int,_int>::at<int>
                                                       ((Map<int,_int> *)local_70,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"1",
                                               "message.map_sfixed32_sfixed32().at(1)",
                                               (int *)local_c0,piVar2);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x133,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_f0.data_._0_4_ = 1;
                                    local_c0 = (undefined1  [8])0x1;
                                    plVar3 = Map<long,_long>::at<long>
                                                       ((Map<long,_long> *)local_78,
                                                        (key_arg<long> *)local_c0);
                                    testing::internal::CmpHelperEQ<int,long>
                                              ((internal *)local_e0,"1",
                                               "message.map_sfixed64_sfixed64().at(1)",
                                               (int *)&local_f0,plVar3);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x134,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    pfVar6 = Map<int,_float>::at<int>
                                                       ((Map<int,_float> *)local_80,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,float>
                                              ((internal *)local_e0,"1",
                                               "message.map_int32_float().at(1)",(int *)local_c0,
                                               pfVar6);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x135,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_f0.data_._0_4_ = 1;
                                    pdVar7 = Map<int,_double>::at<int>
                                                       ((Map<int,_double> *)local_88,
                                                        (key_arg<int> *)&local_f0);
                                    testing::internal::CmpHelperEQ<int,double>
                                              ((internal *)local_e0,"1",
                                               "message.map_int32_double().at(1)",(int *)local_c0,
                                               pdVar7);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x136,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0[0] = (string)0x1;
                                    local_f0.data_._0_4_ = CONCAT31(local_f0.data_._1_3_,1);
                                    pbVar8 = Map<bool,_bool>::at<bool>
                                                       ((Map<bool,_bool> *)local_90,
                                                        (key_arg<bool> *)&local_f0);
                                    testing::internal::CmpHelperEQ<bool,bool>
                                              ((internal *)local_e0,"true",
                                               "message.map_bool_bool().at(1)",(bool *)local_c0,
                                               pbVar8);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x137,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_e0 = (undefined1  [8])&local_d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_e0,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    local_c0 = (undefined1  [8])&local_b0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_c0,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    pbVar9 = Map<std::__cxx11::string,std::__cxx11::string>::
                                             at<std::__cxx11::string>
                                                       ((
                                                  Map<std::__cxx11::string,std::__cxx11::string> *)
                                                  this,(key_arg<std::__cxx11::basic_string<char>_> *
                                                       )local_c0);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)&local_f0,"long_string_2()",
                                               "message.map_string_string().at(long_string_2())",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_e0,pbVar9);
                                    if (local_c0 != (undefined1  [8])&local_b0) {
                                      operator_delete((void *)local_c0,
                                                      local_b0._M_allocated_capacity + 1);
                                    }
                                    if (local_e0 != (undefined1  [8])&local_d0) {
                                      operator_delete((void *)local_e0,
                                                      local_d0._M_allocated_capacity + 1);
                                    }
                                    if (local_f0.data_._0_1_ == (internal)0x0) {
                                      testing::Message::Message((Message *)local_e0);
                                      if (local_e8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_e8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)local_c0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x138,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)local_c0,(Message *)local_e0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)local_c0);
                                      if (local_e0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_e0 + 8))();
                                      }
                                    }
                                    if (local_e8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_e8,local_e8);
                                    }
                                    local_e0 = (undefined1  [8])&local_d0;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_e0,
                                               "This is another very long string that goes in the heap"
                                               ,"");
                                    local_f0.data_._0_4_ = 1;
                                    pbVar9 = Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             ::at<int>((
                                                  Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_98,(key_arg<int> *)&local_f0);
                                    testing::internal::
                                    CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                              ((internal *)local_c0,"long_string_2()",
                                               "message.map_int32_bytes().at(1)",
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_e0,pbVar9);
                                    if (local_e0 != (undefined1  [8])&local_d0) {
                                      operator_delete((void *)local_e0,
                                                      local_d0._M_allocated_capacity + 1);
                                    }
                                    if (local_c0[0] == (string)0x0) {
                                      testing::Message::Message((Message *)local_e0);
                                      if (local_b8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_b8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x139,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_e0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_e0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(size_type *)local_e0 + 8))();
                                      }
                                    }
                                    if (local_b8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_b8,local_b8);
                                    }
                                    local_c0._0_4_ = 2;
                                    local_f0.data_._0_4_ = 1;
                                    pMVar10 = Map<int,_proto2_unittest::MapEnumLite>::at<int>
                                                        ((Map<int,_proto2_unittest::MapEnumLite> *)
                                                         this_00,(key_arg<int> *)&local_f0);
                                    testing::internal::
                                    CmpHelperEQ<proto2_unittest::MapEnumLite,proto2_unittest::MapEnumLite>
                                              ((internal *)local_e0,"MapEnum_BAZ<TestMap>()",
                                               "message.map_int32_enum().at(1)",
                                               (MapEnumLite *)local_c0,pMVar10);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13a,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                    local_c0._0_4_ = 1;
                                    local_9c = 1;
                                    pFVar11 = Map<int,_proto2_unittest::ForeignMessageLite>::at<int>
                                                        ((
                                                  Map<int,_proto2_unittest::ForeignMessageLite> *)
                                                  this_01,&local_9c);
                                    local_f0.data_._0_4_ = (pFVar11->field_0)._impl_.c_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)local_e0,"1",
                                               "message.map_int32_foreign_message().at(1).c()",
                                               (int *)local_c0,(int *)&local_f0);
                                    if (local_e0[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)local_c0);
                                      if (local_d8 ==
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0) {
                                        pcVar12 = "";
                                      }
                                      else {
                                        pcVar12 = (local_d8->_M_dataplus)._M_p;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_f0,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test_util.h"
                                                 ,0x13b,pcVar12);
                                      testing::internal::AssertHelper::operator=
                                                (&local_f0,(Message *)local_c0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_f0);
                                      if (local_c0 != (undefined1  [8])0x0) {
                                        (**(code **)(*(long *)local_c0 + 8))();
                                      }
                                    }
                                    if (local_d8 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_d8,local_d8);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void MapTestUtil::ExpectMapFieldsSet(const TestMap& message) {
  ASSERT_EQ(2, message.map_int32_int32().size());
  ASSERT_EQ(2, message.map_int64_int64().size());
  ASSERT_EQ(2, message.map_uint32_uint32().size());
  ASSERT_EQ(2, message.map_uint64_uint64().size());
  ASSERT_EQ(2, message.map_sint32_sint32().size());
  ASSERT_EQ(2, message.map_sint64_sint64().size());
  ASSERT_EQ(2, message.map_fixed32_fixed32().size());
  ASSERT_EQ(2, message.map_fixed64_fixed64().size());
  ASSERT_EQ(2, message.map_sfixed32_sfixed32().size());
  ASSERT_EQ(2, message.map_sfixed64_sfixed64().size());
  ASSERT_EQ(2, message.map_int32_float().size());
  ASSERT_EQ(2, message.map_int32_double().size());
  ASSERT_EQ(2, message.map_bool_bool().size());
  ASSERT_EQ(2, message.map_string_string().size());
  ASSERT_EQ(2, message.map_int32_bytes().size());
  ASSERT_EQ(2, message.map_int32_enum().size());
  ASSERT_EQ(2, message.map_int32_foreign_message().size());

  EXPECT_EQ(0, message.map_int32_int32().at(0));
  EXPECT_EQ(0, message.map_int64_int64().at(0));
  EXPECT_EQ(0, message.map_uint32_uint32().at(0));
  EXPECT_EQ(0, message.map_uint64_uint64().at(0));
  EXPECT_EQ(0, message.map_sint32_sint32().at(0));
  EXPECT_EQ(0, message.map_sint64_sint64().at(0));
  EXPECT_EQ(0, message.map_fixed32_fixed32().at(0));
  EXPECT_EQ(0, message.map_fixed64_fixed64().at(0));
  EXPECT_EQ(0, message.map_sfixed32_sfixed32().at(0));
  EXPECT_EQ(0, message.map_sfixed64_sfixed64().at(0));
  EXPECT_EQ(0, message.map_int32_float().at(0));
  EXPECT_EQ(0, message.map_int32_double().at(0));
  EXPECT_EQ(false, message.map_bool_bool().at(0));
  EXPECT_EQ(long_string(), message.map_string_string().at(long_string()));
  EXPECT_EQ(long_string(), message.map_int32_bytes().at(0));
  EXPECT_EQ(MapEnum_BAR<TestMap>(), message.map_int32_enum().at(0));
  EXPECT_EQ(0, message.map_int32_foreign_message().at(0).c());

  EXPECT_EQ(1, message.map_int32_int32().at(1));
  EXPECT_EQ(1, message.map_int64_int64().at(1));
  EXPECT_EQ(1, message.map_uint32_uint32().at(1));
  EXPECT_EQ(1, message.map_uint64_uint64().at(1));
  EXPECT_EQ(1, message.map_sint32_sint32().at(1));
  EXPECT_EQ(1, message.map_sint64_sint64().at(1));
  EXPECT_EQ(1, message.map_fixed32_fixed32().at(1));
  EXPECT_EQ(1, message.map_fixed64_fixed64().at(1));
  EXPECT_EQ(1, message.map_sfixed32_sfixed32().at(1));
  EXPECT_EQ(1, message.map_sfixed64_sfixed64().at(1));
  EXPECT_EQ(1, message.map_int32_float().at(1));
  EXPECT_EQ(1, message.map_int32_double().at(1));
  EXPECT_EQ(true, message.map_bool_bool().at(1));
  EXPECT_EQ(long_string_2(), message.map_string_string().at(long_string_2()));
  EXPECT_EQ(long_string_2(), message.map_int32_bytes().at(1));
  EXPECT_EQ(MapEnum_BAZ<TestMap>(), message.map_int32_enum().at(1));
  EXPECT_EQ(1, message.map_int32_foreign_message().at(1).c());
}